

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncmp.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char local_1e [3];
  char local_1b [5];
  char x [2];
  char empty [1];
  char cmpabcd_ [7];
  char cmpabcde [8];
  
  _empty = 0x66006564636261;
  local_1b[0] = 'a';
  local_1b[1] = 'b';
  local_1b[2] = 'c';
  local_1b[3] = 'd';
  stack0xffffffffffffffe9 = 0xfc65;
  x[1] = '\0';
  memset(local_1e + 2,0,1);
  local_1e[0] = 'x';
  local_1e[1] = '\0';
  iVar1 = strncmp("abcde",empty,5);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x2a,"strncmp( abcde, cmpabcde, 5 ) == 0");
  }
  iVar1 = strncmp("abcde",empty,10);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x2b,"strncmp( abcde, cmpabcde, 10 ) == 0");
  }
  iVar1 = strncmp(local_1e + 2,"abcde",5);
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x2e,"strncmp( empty, abcde, 5 ) < 0");
  }
  iVar1 = strncmp("abcde",local_1e + 2,5);
  if (iVar1 < 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x2f,"strncmp( abcde, empty, 5 ) > 0");
  }
  iVar1 = strncmp("abcde",local_1e,1);
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x32,"strncmp( abcde, x, 1 ) < 0");
  }
  iVar1 = strncmp("abcde",local_1b,10);
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x33,"strncmp( abcde, cmpabcd_, 10 ) < 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde\0f";
    char cmpabcd_[] = "abcde\xfc";
    char empty[] = "";
    char x[] = "x";
    TESTCASE( strncmp( abcde, cmpabcde, 5 ) == 0 );
    TESTCASE( strncmp( abcde, cmpabcde, 10 ) == 0 );
    TESTCASE( strncmp( abcde, abcdx, 5 ) < 0 );
    TESTCASE( strncmp( abcdx, abcde, 5 ) > 0 );
    TESTCASE( strncmp( empty, abcde, 5 ) < 0 );
    TESTCASE( strncmp( abcde, empty, 5 ) > 0 );
    TESTCASE( strncmp( abcde, abcdx, 4 ) == 0 );
    TESTCASE( strncmp( abcde, x, 0 ) == 0 );
    TESTCASE( strncmp( abcde, x, 1 ) < 0 );
    TESTCASE( strncmp( abcde, cmpabcd_, 10 ) < 0 );
    return TEST_RESULTS;
}